

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-split.cpp
# Opt level: O0

uint64_t anon_unknown.dwarf_41187::hashFile(string *filename)

{
  vector<char,_std::allocator<char>_> *pvVar1;
  bool bVar2;
  reference pcVar3;
  iterator iStack_48;
  char c;
  iterator __end1;
  iterator __begin1;
  vector<char,_std::allocator<char>_> *__range1;
  size_t digest;
  vector<char,_std::allocator<char>_> contents;
  string *filename_local;
  
  ::wasm::read_file<std::vector<char,std::allocator<char>>>
            ((string *)&digest,(BinaryOption)filename);
  __range1 = (vector<char,_std::allocator<char>_> *)0x0;
  __end1 = std::vector<char,_std::allocator<char>_>::begin
                     ((vector<char,_std::allocator<char>_> *)&digest);
  iStack_48 = std::vector<char,_std::allocator<char>_>::end
                        ((vector<char,_std::allocator<char>_> *)&digest);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffb8);
    pvVar1 = __range1;
    if (!bVar2) break;
    pcVar3 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&__end1);
    ::wasm::hash_combine((size_t *)&__range1,(long)*pcVar3);
    __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator++
              (&__end1);
  }
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&digest);
  return (uint64_t)pvVar1;
}

Assistant:

uint64_t hashFile(const std::string& filename) {
  auto contents(read_file<std::vector<char>>(filename, Flags::Binary));
  size_t digest = 0;
  // Don't use `hash` or `rehash` - they aren't deterministic between executions
  for (char c : contents) {
    hash_combine(digest, c);
  }
  return uint64_t(digest);
}